

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Maybe<kj::Array<kj::String>_> *
kj::parse::
Many_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'#'>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,_'_'>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,_'\n'>,_const_kj::parse::EndOfInput__&>_>_&>,_true>
::Impl<capnp::compiler::Lexer::ParserInput,_kj::String>::apply
          (Maybe<kj::Array<kj::String>_> *__return_storage_ptr__,
          Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,____>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&>
          *subParser,ParserInput *input)

{
  bool bVar1;
  NullableValue<kj::String> *other;
  String *pSVar2;
  Array<kj::String> local_e0;
  int local_c4;
  String *local_c0;
  String *subResult;
  undefined1 local_98 [8];
  NullableValue<kj::String> _subResult425;
  undefined1 local_68 [8];
  ParserInput subInput;
  Results results;
  ParserInput *input_local;
  Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,____>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&>
  *subParser_local;
  
  Vector<kj::String>::Vector((Vector<kj::String> *)&subInput.begin);
  do {
    bVar1 = IteratorInput<char,_const_char_*>::atEnd
                      (&input->super_IteratorInput<char,_const_char_*>);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ::capnp::compiler::Lexer::ParserInput::ParserInput((ParserInput *)local_68,input);
    Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'#'>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,_'_'>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,_'\n'>,_const_kj::parse::EndOfInput__&>_>_&>
    ::operator()<capnp::compiler::Lexer::ParserInput>
              ((Maybe<kj::String> *)&subResult,subParser,(ParserInput *)local_68);
    other = kj::_::readMaybe<kj::String>((Maybe<kj::String> *)&subResult);
    kj::_::NullableValue<kj::String>::NullableValue((NullableValue<kj::String> *)local_98,other);
    Maybe<kj::String>::~Maybe((Maybe<kj::String> *)&subResult);
    pSVar2 = kj::_::NullableValue::operator_cast_to_String_((NullableValue *)local_98);
    if (pSVar2 == (String *)0x0) {
      local_c4 = 3;
    }
    else {
      local_c0 = kj::_::NullableValue<kj::String>::operator*((NullableValue<kj::String> *)local_98);
      IteratorInput<char,_const_char_*>::advanceParent
                ((IteratorInput<char,_const_char_*> *)local_68);
      pSVar2 = mv<kj::String>(local_c0);
      Vector<kj::String>::add<kj::String>((Vector<kj::String> *)&subInput.begin,pSVar2);
      local_c4 = 0;
    }
    kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_98);
    if (local_c4 == 0) {
      local_c4 = 0;
    }
    ::capnp::compiler::Lexer::ParserInput::~ParserInput((ParserInput *)local_68);
  } while (local_c4 == 0);
  bVar1 = Vector<kj::String>::empty((Vector<kj::String> *)&subInput.begin);
  if (bVar1) {
    Maybe<kj::Array<kj::String>_>::Maybe(__return_storage_ptr__);
  }
  else {
    Vector<kj::String>::releaseAsArray(&local_e0,(Vector<kj::String> *)&subInput.begin);
    Maybe<kj::Array<kj::String>_>::Maybe(__return_storage_ptr__,&local_e0);
    Array<kj::String>::~Array(&local_e0);
  }
  local_c4 = 1;
  Vector<kj::String>::~Vector((Vector<kj::String> *)&subInput.begin);
  return __return_storage_ptr__;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_SOME(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(subResult));
      } else {
        break;
      }
    }